

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cc
# Opt level: O1

int OPENSSL_gmtime_diff(int *out_days,int *out_secs,tm *from,tm *to)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int64_t time_from;
  int64_t time_to;
  long local_30;
  long local_28;
  
  iVar2 = OPENSSL_tm_to_posix(to,&local_28);
  iVar3 = 0;
  if (iVar2 != 0) {
    iVar2 = OPENSSL_tm_to_posix(from,&local_30);
    iVar3 = 0;
    if (iVar2 != 0) {
      auVar1 = SEXT816(local_28 - local_30) * SEXT816(0x1845c8a0ce512957);
      iVar3 = (int)(auVar1._8_8_ >> 0xd) - (auVar1._12_4_ >> 0x1f);
      *out_secs = (int)(local_28 - local_30) + iVar3 * -0x15180;
      *out_days = iVar3;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int OPENSSL_gmtime_diff(int *out_days, int *out_secs, const struct tm *from,
                        const struct tm *to) {
  int64_t time_to, time_from;
  if (!OPENSSL_tm_to_posix(to, &time_to) ||
      !OPENSSL_tm_to_posix(from, &time_from)) {
    return 0;
  }
  // Times are in range, so these calculations can not overflow.
  static_assert(SECS_PER_DAY <= INT_MAX, "seconds per day does not fit in int");
  static_assert((MAX_POSIX_TIME - MIN_POSIX_TIME) / SECS_PER_DAY <= INT_MAX,
                "range of valid POSIX times, in days, does not fit in int");
  int64_t timediff = time_to - time_from;
  int64_t daydiff = timediff / SECS_PER_DAY;
  timediff %= SECS_PER_DAY;
  *out_secs = (int)timediff;
  *out_days = (int)daydiff;
  return 1;
}